

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateSwitch(ExpressionEvalContext *ctx,ExprSwitch *expression)

{
  uint uVar1;
  StackFrame *pSVar2;
  Allocator *pAVar3;
  SynBase *pSVar4;
  TypeBase *pTVar5;
  bool bVar6;
  int iVar7;
  ExprIntegerLiteral *expr;
  ExprBase *pEVar8;
  ExprBase *pEVar9;
  _func_int **pp_Var10;
  undefined4 extraout_var;
  char *msg;
  ExprBase *expression_00;
  
  if (ctx->instruction < ctx->instructionsLimit) {
    ctx->instruction = ctx->instruction + 1;
    uVar1 = (ctx->stackFrames).count;
    if (uVar1 == 0) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x172,
                    "T &SmallArray<ExpressionEvalContext::StackFrame *, 32>::back() [T = ExpressionEvalContext::StackFrame *, N = 32]"
                   );
    }
    pSVar2 = (ctx->stackFrames).data[uVar1 - 1];
    if (pSVar2->targetYield == 0) {
      pEVar8 = Evaluate(ctx,expression->condition);
      if (pEVar8 == (ExprBase *)0x0) {
        return (ExprBase *)0x0;
      }
      pEVar8 = (expression->cases).head;
      expression_00 = (expression->blocks).head;
      if (expression_00 != (ExprBase *)0x0 && pEVar8 != (ExprBase *)0x0) {
        bVar6 = false;
        do {
          if (ctx->instructionsLimit <= ctx->instruction) goto LAB_0013dbb3;
          ctx->instruction = ctx->instruction + 1;
          if (bVar6) {
LAB_0013db72:
            pEVar9 = Evaluate(ctx,expression_00);
            if (pEVar9 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
            bVar6 = true;
            if (pSVar2->breakDepth != 0) {
              pSVar2->breakDepth = pSVar2->breakDepth - 1;
              goto LAB_0013dbde;
            }
          }
          else {
            pEVar9 = Evaluate(ctx,pEVar8);
            if (pEVar9 == (ExprBase *)0x0) {
              return (ExprBase *)0x0;
            }
            switch(pEVar9->typeID) {
            case 3:
              pp_Var10 = (_func_int **)(ulong)(byte)pEVar9->field_0x29;
              break;
            case 4:
              pp_Var10 = (_func_int **)(long)(char)pEVar9->field_0x29;
              break;
            default:
              msg = "ERROR: failed to evaluate \'case\' value";
              goto LAB_0013dbba;
            case 6:
              pp_Var10 = pEVar9[1]._vptr_ExprBase;
              break;
            case 7:
              pp_Var10 = (_func_int **)(long)(double)pEVar9[1]._vptr_ExprBase;
            }
            if (pp_Var10 != (_func_int **)0x0) goto LAB_0013db72;
            bVar6 = false;
          }
          pEVar8 = pEVar8->next;
        } while ((pEVar8 != (ExprBase *)0x0) &&
                (expression_00 = expression_00->next, expression_00 != (ExprBase *)0x0));
      }
      if (expression->defaultBlock != (ExprBase *)0x0) {
        pEVar8 = Evaluate(ctx,expression->defaultBlock);
        if (pEVar8 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (pSVar2->breakDepth != 0) {
          pSVar2->breakDepth = pSVar2->breakDepth - 1;
        }
      }
LAB_0013dbde:
      pAVar3 = ctx->ctx->allocator;
      iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var,iVar7);
      pSVar4 = (expression->super_ExprBase).source;
      pTVar5 = ctx->ctx->typeVoid;
      pEVar8->typeID = 2;
      pEVar8->source = pSVar4;
      pEVar8->type = pTVar5;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223698;
      pEVar8 = CheckType(&expression->super_ExprBase,pEVar8);
      return pEVar8;
    }
    msg = "ERROR: can\'t yield back into a switch statement";
  }
  else {
LAB_0013dbb3:
    msg = "ERROR: instruction limit reached";
  }
LAB_0013dbba:
  Report(ctx,msg);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateSwitch(ExpressionEvalContext &ctx, ExprSwitch *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(frame->targetYield)
		return Report(ctx, "ERROR: can't yield back into a switch statement");

	ExprBase *condition = Evaluate(ctx, expression->condition);

	if(!condition)
		return NULL;

	bool matched = false;

	for(ExprBase *currCase = expression->cases.head, *currBlock = expression->blocks.head; currCase && currBlock; currCase = currCase->next, currBlock = currBlock->next)
	{
		if(!AddInstruction(ctx))
			return NULL;

		if(!matched)
		{
			ExprBase *value = Evaluate(ctx, currCase);

			if(!value)
				return NULL;

			long long result;
			if(!TryTakeLong(value, result))
				return Report(ctx, "ERROR: failed to evaluate 'case' value");

			// Try next case
			if(!result)
				continue;

			matched = true;
		}

		if(!Evaluate(ctx, currBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	if(expression->defaultBlock)
	{
		if(!Evaluate(ctx, expression->defaultBlock))
			return NULL;

		// On break, decrease depth and exit
		if(frame->breakDepth)
		{
			frame->breakDepth--;

			return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}